

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O2

int Dau_DecPerform6(word *p,int nVars,uint uSet)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  word wVar15;
  int nVarsD;
  int nVarsC;
  int nVarsS;
  word tComp;
  uint local_8d4;
  int local_8d0;
  uint local_8cc;
  ulong local_8c8;
  ulong local_8c0;
  ulong local_8b8;
  ulong local_8b0;
  word *local_8a8;
  ulong local_8a0;
  word tDec0;
  ulong local_890;
  int pPermD [16];
  int pPermC [16];
  char pDsdD [1000];
  char pDsdC [1000];
  
  tComp = 0;
  local_8d0 = nVars;
  local_8a8 = p;
  iVar1 = Dau_DecDecomposeSet(p,nVars,uSet,&tComp,&tDec0,pPermC,pPermD,&nVarsC,&nVarsD,&nVarsS);
  if (iVar1 == 0) {
    puts("  Decomposition does not exist");
    iVar1 = 0;
  }
  else {
    uVar6 = nVarsC - 1;
    if (5 < uVar6) {
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x337,"word Abc_Tt6Cofactor0(word, int)");
    }
    lVar11 = (long)nVarsS;
    uVar9 = nVarsC + ~nVarsS;
    local_8b0 = (ulong)uVar9;
    lVar14 = (long)nVarsD;
    bVar2 = (byte)(1 << ((byte)uVar6 & 0x1f));
    local_8b8 = (s_Truths6Neg[uVar6] & tComp) << (bVar2 & 0x3f) | s_Truths6Neg[uVar6] & tComp;
    local_8c0 = (tComp & s_Truths6[uVar6]) >> (bVar2 & 0x3f) | tComp & s_Truths6[uVar6];
    bVar2 = (byte)(1 << ((byte)nVarsS & 0x1f)) & 0x1f;
    uVar6 = 1 << bVar2;
    local_8c8 = tDec0;
    if (1 << bVar2 < 1) {
      uVar6 = 0;
    }
    local_8a0 = 0;
    local_8d4 = uVar6;
    for (uVar5 = 0; iVar1 = 1, uVar5 != uVar6; uVar5 = uVar5 + 1) {
      if ((uVar5 & 1) == 0) {
        bVar2 = (byte)nVarsS & 0x1f;
        uVar6 = 0;
        uVar8 = 0;
        if (0 < nVarsS) {
          uVar8 = (ulong)(uint)nVarsS;
        }
        uVar7 = 1 << bVar2;
        if (1 << bVar2 < 1) {
          uVar7 = 0;
        }
        local_890 = 0;
        uVar3 = 0;
        for (; uVar6 != uVar7; uVar6 = uVar6 + 1) {
          if ((uVar5 >> (uVar6 & 0x1f) & 1) != 0) {
            uVar10 = 0xffffffffffffffff;
            uVar12 = uVar10;
            for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
              uVar4 = s_Truths6[uVar13 + (long)(int)uVar9];
              if ((uVar6 >> ((uint)uVar13 & 0x1f) & 1) == 0) {
                uVar4 = ~uVar4;
                wVar15 = ~s_Truths6[uVar13 + (lVar14 - lVar11)];
              }
              else {
                wVar15 = s_Truths6[uVar13 + (lVar14 - lVar11)];
              }
              uVar12 = uVar12 & uVar4;
              uVar10 = uVar10 & wVar15;
            }
            uVar3 = uVar3 | uVar12;
            local_890 = local_890 | uVar10;
          }
        }
        uVar8 = uVar3 & local_8c0 | local_8b8 & ~uVar3;
        tComp = ((uVar3 & local_8b8 | ~uVar3 & local_8c0) ^ uVar8) &
                s_Truths6[nVarsS + (int)local_8b0] ^ uVar8;
        local_890 = local_890 ^ local_8c8;
        Dau_DsdDecompose(&tComp,nVarsC,0,1,pDsdC);
        Dau_DsdDecompose(&local_890,nVarsD,0,1,pDsdD);
        Dau_DecVarReplace(pDsdD,pPermD,nVarsD);
        Dau_DecVarReplace(pDsdC,pPermC,nVarsC);
        local_8cc = (int)local_8a0 + 1;
        printf("%3d : ");
        printf("%24s  ",pDsdD);
        printf("%24s  ",pDsdC);
        Dau_DecVerify(local_8a8,local_8d0,pDsdC,pDsdD);
        local_8a0 = (ulong)local_8cc;
        uVar6 = local_8d4;
      }
    }
  }
  return iVar1;
}

Assistant:

int Dau_DecPerform6( word * p, int nVars, unsigned uSet )
{
    word tComp = 0, tDec = 0, tDec0, tComp0, tComp1, FuncC, FuncD;
    char pDsdC[1000], pDsdD[1000];
    int pPermC[16], pPermD[16];
    int nVarsC, nVarsD, nVarsS, nVarsU, nVarsF, nPairs;
    int i, m, v, status, ResC, ResD, Counter = 0;
    status = Dau_DecDecomposeSet( p, nVars, uSet, &tComp, &tDec0, pPermC, pPermD, &nVarsC, &nVarsD, &nVarsS );
    if ( !status )
    {
        printf( "  Decomposition does not exist\n" );
        return 0;
    }
    nVarsU = nVarsD - nVarsS;
    nVarsF = nVarsC - nVarsS - 1;
    tComp0 = Abc_Tt6Cofactor0( tComp, nVarsF + nVarsS );
    tComp1 = Abc_Tt6Cofactor1( tComp, nVarsF + nVarsS );
    nPairs = 1 << (1 << nVarsS); 
    for ( i = 0; i < nPairs; i++ )
    {
        if ( i & 1 )
            continue;
        // create miterms with this polarity
        FuncC = FuncD = 0;
        for ( m = 0; m < (1 << nVarsS); m++ )
        {
            word MintC, MintD;
            if ( !((i >> m) & 1) )
                continue;
            MintC = MintD = ~(word)0;
            for ( v = 0; v < nVarsS; v++ )
            {
                MintC &= ((m >> v) & 1) ? s_Truths6[nVarsF+v] : ~s_Truths6[nVarsF+v];
                MintD &= ((m >> v) & 1) ? s_Truths6[nVarsU+v] : ~s_Truths6[nVarsU+v];
            }
            FuncC |= MintC;
            FuncD |= MintD;
        }
        // uncomplement given variables
        tComp = (~s_Truths6[nVarsF + nVarsS] & ((tComp0 & ~FuncC) | (tComp1 & FuncC))) | (s_Truths6[nVarsF + nVarsS] & ((tComp1 & ~FuncC) | (tComp0 & FuncC)));
        tDec = tDec0 ^ FuncD;
        // decompose
        ResC = Dau_DsdDecompose( &tComp, nVarsC, 0, 1, pDsdC );
        ResD = Dau_DsdDecompose( &tDec, nVarsD, 0, 1, pDsdD );
        // replace variables
        Dau_DecVarReplace( pDsdD, pPermD, nVarsD );
        Dau_DecVarReplace( pDsdC, pPermC, nVarsC );
        // report
//        printf( "  " );
        printf( "%3d : ", Counter++ );
        printf( "%24s  ", pDsdD );
        printf( "%24s  ", pDsdC );
        Dau_DecVerify( p, nVars, pDsdC, pDsdD );
    }
    return 1;
}